

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O3

void curses_display_buffer(char *inbuf,nh_bool trymove)

{
  nh_menuitem_conflict *pnVar1;
  char cVar2;
  char *__ptr;
  nh_menuitem_conflict *items;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  char *__s;
  int iVar7;
  char *__s_00;
  byte bVar8;
  long lVar9;
  char linebuf [256];
  char buf [256];
  char local_238;
  char local_237 [254];
  undefined1 local_139;
  char local_138 [264];
  
  __ptr = strdup(inbuf);
  items = (nh_menuitem_conflict *)malloc(0xa78);
  if (*__ptr == '\0') {
    lVar9 = 0;
LAB_0011841f:
    curses_display_menu(items,(wchar_t)lVar9,(char *)0x0,L'\0',(wchar_t *)0x0);
    free(items);
    free(__ptr);
    return;
  }
  iVar7 = 10;
  lVar9 = 0;
  __s = __ptr;
LAB_001182a1:
  pcVar3 = strchr(__s,10);
  if (pcVar3 != (char *)0x0) {
    if ((__s < pcVar3) && (pcVar3[-1] == '\r')) {
      pcVar3[-1] = '\0';
    }
    *pcVar3 = '\0';
  }
  strncpy(&local_238,__s,0x100);
  local_139 = 0;
  pcVar4 = strchr(&local_238,9);
  if ((pcVar4 != (char *)0x0) && (local_238 != '\0')) {
    bVar8 = 0;
    pcVar4 = local_237;
    __s_00 = local_138;
    cVar2 = local_238;
    do {
      if (cVar2 == '\t') {
        uVar6 = (ulong)((bVar8 ^ 7) & 7);
        memset(__s_00,0x20,uVar6 + 1);
        __s_00 = __s_00 + uVar6;
        bVar8 = bVar8 + ((bVar8 ^ 7) & 7);
      }
      else {
        if (cVar2 == '\0') goto LAB_00118376;
        *__s_00 = cVar2;
      }
      bVar8 = bVar8 + 1;
      __s_00 = __s_00 + 1;
      cVar2 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while( true );
  }
  goto LAB_0011839f;
LAB_00118376:
  *__s_00 = '\0';
  strcpy(&local_238,local_138);
LAB_0011839f:
  if (iVar7 <= lVar9) {
    iVar7 = iVar7 * 2;
    items = (nh_menuitem_conflict *)realloc(items,(long)iVar7 * 0x10c);
  }
  pnVar1 = items + lVar9;
  pnVar1->id = L'\0';
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,&local_238);
  if (pcVar3 == (char *)0x0) {
    sVar5 = strlen(__s);
    __s = __s + sVar5;
  }
  else {
    __s = pcVar3 + 1;
  }
  lVar9 = lVar9 + 1;
  if (*__s == '\0') goto LAB_0011841f;
  goto LAB_001182a1;
}

Assistant:

void curses_display_buffer(const char *inbuf, nh_bool trymove)
{
    char *line, *line_end, *buf;
    char linebuf[BUFSZ];
    int icount, size;
    struct nh_menuitem *items;

    buf = strdup(inbuf);
    icount = 0;
    size = 10;
    items = malloc(size * sizeof(struct nh_menuitem));

    line = buf;
    while (*line) {
	line_end = strchr(line, '\n');
	if (line_end) {
	    /* deal with the CR that Windows adds to the LF */
	    if (line_end > line && *(line_end - 1) == '\r')
		*(line_end - 1) = '\0';
	    *line_end = '\0';
	}

	strncpy(linebuf, line, BUFSZ);
	linebuf[BUFSZ - 1] = '\0';
	if (strchr(linebuf, '\t') != 0)
	    tabexpand(linebuf);
	add_menu_txt(items, size, icount, linebuf, MI_TEXT);

	if (line_end) {
	    line = line_end + 1;
	} else {
	    /* null terminator guaranteed if earlier strdup() succeeded */
	    line = strchr(line, '\0');
	}
    }

    curses_display_menu(items, icount, NULL, PICK_NONE, NULL);
    free(items);
    free(buf);
}